

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
          (String *__return_storage_ptr__,kj *this,char **params,char *params_1,uint *params_2,
          char (*params_3) [3],char **params_4)

{
  char *pcVar1;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar2;
  ArrayPtr<const_char> local_78;
  undefined1 local_68 [24];
  size_t local_50;
  CappedArray<char,_14UL> local_48;
  
  pcVar1 = *(char **)this;
  local_50 = strlen(pcVar1);
  uVar2 = *(undefined1 *)params;
  local_68._16_8_ = pcVar1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_1);
  local_68._8_8_ = strlen((char *)params_2);
  pcVar1 = *(char **)params_3;
  local_68._0_8_ = params_2;
  local_78.size_ = strlen(pcVar1);
  local_78.ptr = pcVar1;
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)(local_68 + 0x10),
             (ArrayPtr<const_char> *)&stack0xffffffffffffff7f,(FixedArray<char,_1UL> *)&local_48,
             (CappedArray<char,_14UL> *)local_68,&local_78,
             (ArrayPtr<const_char> *)CONCAT17(uVar2,in_stack_ffffffffffffff78));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}